

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::NextColumn(void)

{
  ImGuiColumns *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  float fVar6;
  float width;
  float offset_1;
  float offset_0;
  float column_padding;
  ImGuiColumns *columns;
  ImGuiContext *g;
  ImGuiWindow *window;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  float local_24;
  float in_stack_ffffffffffffffe0;
  float item_width;
  
  pIVar5 = GetCurrentWindow();
  pIVar3 = GImGui;
  if (((pIVar5->SkipItems & 1U) == 0) && ((pIVar5->DC).CurrentColumns != (ImGuiColumns *)0x0)) {
    pIVar1 = (pIVar5->DC).CurrentColumns;
    if (pIVar1->Count == 1) {
      (pIVar5->DC).CursorPos.x =
           (float)(int)((pIVar5->Pos).x + (pIVar5->DC).Indent.x + (pIVar5->DC).ColumnsOffset.x);
    }
    else {
      PopItemWidth();
      PopClipRect();
      item_width = (pIVar3->Style).ItemSpacing.x;
      fVar6 = ImMax<float>(pIVar1->LineMaxY,(pIVar5->DC).CursorPos.y);
      pIVar1->LineMaxY = fVar6;
      iVar4 = pIVar1->Current + 1;
      pIVar1->Current = iVar4;
      if (iVar4 < pIVar1->Count) {
        fVar6 = GetColumnOffset((int)in_stack_ffffffffffffffe0);
        (pIVar5->DC).ColumnsOffset.x = (fVar6 - (pIVar5->DC).Indent.x) + item_width;
        ImDrawList::ChannelsSetCurrent
                  ((ImDrawList *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
      }
      else {
        fVar6 = ImMax<float>(item_width - (pIVar5->WindowPadding).x,0.0);
        (pIVar5->DC).ColumnsOffset.x = fVar6;
        ImDrawList::ChannelsSetCurrent
                  ((ImDrawList *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
        pIVar1->Current = 0;
        pIVar1->LineMinY = pIVar1->LineMaxY;
      }
      (pIVar5->DC).CursorPos.x =
           (float)(int)((pIVar5->Pos).x + (pIVar5->DC).Indent.x + (pIVar5->DC).ColumnsOffset.x);
      (pIVar5->DC).CursorPos.y = pIVar1->LineMinY;
      ImVec2::ImVec2((ImVec2 *)&local_24,0.0,0.0);
      IVar2.y = in_stack_ffffffffffffffe0;
      IVar2.x = local_24;
      (pIVar5->DC).CurrLineSize = IVar2;
      (pIVar5->DC).CurrLineTextBaseOffset = 0.0;
      PushColumnClipRect((int)item_width);
      GetColumnOffset((int)in_stack_ffffffffffffffe0);
      fVar6 = GetColumnOffset((int)in_stack_ffffffffffffffe0);
      PushItemWidth(item_width);
      (pIVar5->WorkRect).Max.x = ((pIVar5->Pos).x + fVar6) - item_width;
    }
  }
  return;
}

Assistant:

void ImGui::NextColumn()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems || window->DC.CurrentColumns == NULL)
        return;

    ImGuiContext& g = *GImGui;
    ImGuiColumns* columns = window->DC.CurrentColumns;

    if (columns->Count == 1)
    {
        window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
        IM_ASSERT(columns->Current == 0);
        return;
    }
    PopItemWidth();
    PopClipRect();

    const float column_padding = g.Style.ItemSpacing.x;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    if (++columns->Current < columns->Count)
    {
        // Columns 1+ ignore IndentX (by canceling it out)
        // FIXME-COLUMNS: Unnecessary, could be locked?
        window->DC.ColumnsOffset.x = GetColumnOffset(columns->Current) - window->DC.Indent.x + column_padding;
        window->DrawList->ChannelsSetCurrent(columns->Current + 1);
    }
    else
    {
        // New row/line
        // Column 0 honor IndentX
        window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
        window->DrawList->ChannelsSetCurrent(1);
        columns->Current = 0;
        columns->LineMinY = columns->LineMaxY;
    }
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->DC.CursorPos.y = columns->LineMinY;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    window->DC.CurrLineTextBaseOffset = 0.0f;

    PushColumnClipRect(columns->Current);     // FIXME-COLUMNS: Could it be an overwrite?

    // FIXME-COLUMNS: Share code with BeginColumns() - move code on columns setup.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}